

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBufferCase::GetAlignment
          (UniformBufferBufferCase *this)

{
  bool bVar1;
  int *piVar2;
  TestLog *this_00;
  MessageBuilder *this_01;
  MessageBuilder local_1a8;
  undefined1 local_24 [8];
  StateQueryMemoryWriteGuard<int> state;
  UniformBufferBufferCase *this_local;
  
  state._4_8_ = this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_24);
  piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_24);
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a34,piVar2);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_24,
                     (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  if (bVar1) {
    piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_24);
    if (*piVar2 < 0x101) {
      piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_24);
      this_local._4_4_ = *piVar2;
    }
    else {
      this_00 = tcu::TestContext::getLog
                          ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_1a8,
                           (char (*) [70])
                           "// ERROR: UNIFORM_BUFFER_OFFSET_ALIGNMENT has a maximum value of 256.");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      tcu::TestContext::setTestResult
                ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "invalid UNIFORM_BUFFER_OFFSET_ALIGNMENT value");
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int GetAlignment()
	{
		StateQueryMemoryWriteGuard<GLint> state;
		glGetIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &state);

		if (!state.verifyValidity(m_testCtx))
			return -1;

		if (state <= 256)
			return state;

		m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: UNIFORM_BUFFER_OFFSET_ALIGNMENT has a maximum value of 256." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid UNIFORM_BUFFER_OFFSET_ALIGNMENT value");

		return -1;
	}